

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O1

void set_mul(FM_OPL *OPL,int slot,int v)

{
  ulong uVar1;
  byte bVar2;
  OPL_CH *CH;
  
  CH = OPL->P_CH + slot / 2;
  uVar1 = (ulong)((slot & 1U) * 0x60);
  *(UINT8 *)((long)CH->SLOT[0].op1_out + (uVar1 - 0x19)) =
       "\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[v & 0xf];
  bVar2 = (byte)v;
  *(byte *)((long)CH->SLOT[0].op1_out + (uVar1 - 0x1c)) = (byte)~bVar2 >> 3 & 2;
  *(byte *)((long)CH->SLOT[0].op1_out + uVar1 + 9) = bVar2 & 0x20;
  *(byte *)((long)CH->SLOT[0].op1_out + uVar1 + 0x2c) = bVar2 & 0x40;
  *(int *)((long)CH->SLOT[0].op1_out + uVar1 + 0x28) = (int)(char)bVar2 >> 7;
  CALC_FCSLOT(CH,(OPL_SLOT *)((long)CH->SLOT[0].op1_out + (uVar1 - 0x28)));
  return;
}

Assistant:

void set_mul(FM_OPL *OPL,int slot,int v)
{
	OPL_CH   *CH   = &OPL->P_CH[slot/2];
	OPL_SLOT *SLOT = &CH->SLOT[slot&1];

	SLOT->mul     = mul_tab[v&0x0f];
	SLOT->KSR     = (v&0x10) ? 0 : 2;
	SLOT->eg_type = (v&0x20);
	SLOT->vib     = (v&0x40);
	SLOT->AMmask  = (v&0x80) ? ~0 : 0;
	CALC_FCSLOT(CH,SLOT);
}